

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupport_c_FailWillNotCrashIfNotEnabled_Test::testBody
          (TEST_MockSupport_c_FailWillNotCrashIfNotEnabled_Test *this)

{
  byte bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  size_t sVar4;
  undefined1 local_40 [8];
  TestTestingFixture fixture;
  TEST_MockSupport_c_FailWillNotCrashIfNotEnabled_Test *this_local;
  
  cpputestHasCrashed = false;
  fixture.result_ = (TestResult *)this;
  TestTestingFixture::TestTestingFixture((TestTestingFixture *)local_40);
  UtestShell::setCrashMethod(crashMethod);
  TestTestingFixture::setTestFunction((TestTestingFixture *)local_40,failedCallToMockC);
  TestTestingFixture::runAllTests((TestTestingFixture *)local_40);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = cpputestHasCrashed ^ 1;
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)(bVar1 & 1),"CHECK_FALSE","cpputestHasCrashed",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
             ,699,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  sVar4 = TestTestingFixture::getFailureCount((TestTestingFixture *)local_40);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,1,sVar4,"LONGS_EQUAL(1, fixture.getFailureCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockSupport_cTest.cpp"
             ,700,pTVar3);
  UtestShell::resetCrashMethod();
  TestTestingFixture::~TestTestingFixture((TestTestingFixture *)local_40);
  return;
}

Assistant:

TEST(MockSupport_c, FailWillNotCrashIfNotEnabled)
{
    cpputestHasCrashed = false;
    TestTestingFixture fixture;
    UtestShell::setCrashMethod(crashMethod);

    fixture.setTestFunction(failedCallToMockC);

    fixture.runAllTests();

    CHECK_FALSE(cpputestHasCrashed);
    LONGS_EQUAL(1, fixture.getFailureCount());

    UtestShell::resetCrashMethod();
}